

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

bool genVulkanFunctionsH(QList<VkSpecParser::Command> *commands,
                        QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
                        QString *outputBase)

{
  char cVar1;
  bool bVar2;
  QString *pQVar3;
  Data *pDVar4;
  QStringBuilder<const_QString_&,_QString> *pQVar5;
  char16_t *pcVar6;
  QString *key;
  long lVar7;
  Command *c;
  Command *c_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_100;
  QArrayDataPointer<char> local_e8;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<QString> local_a0;
  QStringBuilder<const_QString_&,_QString> local_88;
  QStringBuilder<const_QString_&,_QString> local_68;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  local_b8.size = 0;
  local_a0.d = (Data *)0x0;
  local_88.b.d.d._0_4_ = 0;
  local_88.b.d.d._4_4_ = 0;
  local_a0.ptr = (QString *)0x0;
  local_a0.size = 0;
  local_88.b.d.ptr._0_4_ = 0x10a1ce;
  local_88.b.d.ptr._4_4_ = 0;
  local_88.b.d.size = 2;
  local_88.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>((QString *)&local_68,&local_88);
  QFile::QFile((QFile *)&local_48,(QString *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88.b.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  cVar1 = QFile::open((QFile *)&local_48,0x12);
  if (cVar1 == '\0') {
    local_88.a._0_4_ = 2;
    local_88.b.d.ptr._4_4_ = 0;
    local_88.a._4_4_ = 0;
    local_88.b.d.d._0_4_ = 0;
    local_88.b.d.d._4_4_ = 0;
    local_88.b.d.ptr._0_4_ = 0;
    local_88.b.d.size = 0x10ab99;
    QFile::fileName();
    QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_a0);
    pDVar4 = local_68.b.d.d;
    if (local_68.b.d.d == (Data *)0x0) {
      pDVar4 = (Data *)&QByteArray::_empty;
    }
    QMessageLogger::warning((char *)&local_88,"Failed to write %s",pDVar4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
  }
  else {
    local_88.a._0_4_ = 0;
    local_88.a._4_4_ = 0;
    local_88.b.d.d._0_4_ = 0;
    local_88.b.d.d._4_4_ = 0;
    local_88.b.d.ptr._0_4_ = 0;
    local_88.b.d.ptr._4_4_ = 0;
    local_68.a = (QString *)0x0;
    local_68.b.d.d = (Data *)0x0;
    local_68.b.d.ptr = (char16_t *)0x0;
    pQVar3 = VERSIONS.d.ptr + VERSIONS.d.size;
    for (key = VERSIONS.d.ptr; key != pQVar3; key = key + 1) {
      QMap<QString,_QList<QString>_>::operator[]
                ((QList<QString> *)&local_a0,versionCommandMapping,key);
      local_b8.d = (Data *)0x10aacc;
      local_b8.size = 0x10ab00;
      local_b8.ptr = (char16_t *)key;
      operator+=((QString *)&local_88,
                 (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                  *)&local_b8);
      local_b8.d = (Data *)0x10aacc;
      local_b8.size = 0x10ab00;
      local_b8.ptr = (char16_t *)key;
      operator+=((QString *)&local_68,
                 (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                  *)&local_b8);
      c_00 = (commands->d).ptr;
      for (lVar7 = (commands->d).size * 0x68; lVar7 != 0; lVar7 = lVar7 + -0x68) {
        bVar2 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_a0,(QString *)c_00,CaseSensitive);
        if (bVar2) {
          pQVar5 = &local_88;
          if (c_00->deviceLevel != false) {
            pQVar5 = &local_68;
          }
          local_d0.d = (Data *)0x0;
          local_d0.ptr = (char16_t *)0x0;
          local_b8.d = (Data *)0x0;
          local_b8.ptr = L"    ";
          local_d0.size = 0;
          local_b8.size = 4;
          QString::append((QString *)pQVar5);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
          funcSig((QString *)&local_b8,c_00,(char *)0x0);
          QString::append((QString *)pQVar5);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          local_d0.d = (Data *)0x0;
          local_d0.ptr = (char16_t *)0x0;
          local_b8.d = (Data *)0x0;
          local_b8.ptr = L";\n";
          local_d0.size = 0;
          local_b8.size = 2;
          QString::append((QString *)pQVar5);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
        }
        c_00 = c_00 + 1;
      }
      QString::operator+=((QString *)&local_88,"#endif\n");
      QString::operator+=((QString *)&local_68,"#endif\n");
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a0);
    }
    Preamble::get((QByteArray *)&local_d0,&preamble,licHeaderFn);
    pcVar6 = local_d0.ptr;
    if (local_d0.ptr == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_e8);
    if (local_e8.ptr == (char *)0x0) {
      local_e8.ptr = (char *)&QByteArray::_empty;
    }
    QString::toUtf8_helper((QString *)&local_100);
    if (local_100.ptr == (char *)0x0) {
      local_100.ptr = (char *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_b8,
                      "%s\n#ifndef QVULKANFUNCTIONS_H\n#define QVULKANFUNCTIONS_H\n\n#if 0\n#pragma qt_no_master_include\n#endif\n\n#include <QtGui/qtguiglobal.h>\n\n#if QT_CONFIG(vulkan) || defined(Q_QDOC)\n\n#ifndef VK_NO_PROTOTYPES\n#define VK_NO_PROTOTYPES\n#endif\n#include <vulkan/vulkan.h>\n\n#include <QtCore/qscopedpointer.h>\n\nQT_BEGIN_NAMESPACE\n\nclass QVulkanInstance;\nclass QVulkanFunctionsPrivate;\nclass QVulkanDeviceFunctionsPrivate;\n\nclass Q_GUI_EXPORT QVulkanFunctions\n{\npublic:\n    ~QVulkanFunctions();\n\n%s\nprivate:\n    Q_DISABLE_COPY(QVulkanFunctions)\n    QVulkanFunctions(QVulkanInstance *inst);\n\n    QScopedPointer<QVulkanFunctionsPrivate> d_ptr;\n    friend class QVulkanInstance;\n};\n\nclass Q_GUI_EXPORT QVulkanDeviceFunctions\n{\npublic:\n    ~QVulkanDeviceFunctions();\n\n%s\nprivate:\n    Q_DISABLE_COPY(QVulkanDeviceFunctions)\n    QVulkanDeviceFunctions(QVulkanInstance *inst, VkDevice device);\n\n    QScopedPointer<QVulkanDeviceFunctionsPrivate> d_ptr;\n    friend class QVulkanInstance;\n};\n\nQT_END_NAMESPACE\n\n#endif // QT_CONFIG(vulkan) || defined(Q_QDOC)\n\n#endif // QVULKANFUNCTIONS_H\n"
                      ,pcVar6,local_e8.ptr,local_100.ptr);
    QString::toUtf8_helper((QString *)&local_a0);
    QIODevice::write(&local_48);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_100);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool genVulkanFunctionsH(const QList<VkSpecParser::Command> &commands,
                         const QMap<QString, QStringList> &versionCommandMapping,
                         const QString &licHeaderFn,
                         const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral(".h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_H\n"
"#define QVULKANFUNCTIONS_H\n"
"\n"
"#if 0\n"
"#pragma qt_no_master_include\n"
"#endif\n"
"\n"
"#include <QtGui/qtguiglobal.h>\n"
"\n"
"#if QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#ifndef VK_NO_PROTOTYPES\n"
"#define VK_NO_PROTOTYPES\n"
"#endif\n"
"#include <vulkan/vulkan.h>\n"
"\n"
"#include <QtCore/qscopedpointer.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"class QVulkanFunctionsPrivate;\n"
"class QVulkanDeviceFunctionsPrivate;\n"
"\n"
"class Q_GUI_EXPORT QVulkanFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanFunctions)\n"
"    QVulkanFunctions(QVulkanInstance *inst);\n"
"\n"
"    QScopedPointer<QVulkanFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"class Q_GUI_EXPORT QVulkanDeviceFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanDeviceFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanDeviceFunctions)\n"
"    QVulkanDeviceFunctions(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    QScopedPointer<QVulkanDeviceFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#endif // QVULKANFUNCTIONS_H\n";

    QString instCmdStr;
    QString devCmdStr;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdStr += "#if " + version + "\n";
        devCmdStr += "#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdStr : &instCmdStr;
            *dst += QStringLiteral("    ");
            *dst += funcSig(c);
            *dst += QStringLiteral(";\n");
        }
        instCmdStr += "#endif\n";
        devCmdStr += "#endif\n";
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdStr.toUtf8().constData(),
                              devCmdStr.toUtf8().constData()).toUtf8());

    return true;
}